

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O3

void __thiscall unitOps_inequality1_Test::TestBody(unitOps_inequality1_Test *this)

{
  bool bVar1;
  pointer *__ptr;
  int iVar2;
  char *pcVar3;
  double dVar4;
  double dVar5;
  unit u2;
  unit u3;
  unit u1;
  int eqFailNeg;
  int eqFailPos;
  unit local_68;
  unit local_60;
  unit local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  int local_44;
  int local_40;
  float local_3c;
  double local_38;
  double local_30;
  
  iVar2 = 0;
  local_40 = 0;
  local_44 = 0;
  dVar4 = 1.0;
  do {
    local_3c = (float)dVar4;
    dVar5 = 1e-05;
    local_38 = dVar4;
    do {
      local_58.multiplier_ = local_3c;
      local_58.base_units_ = (unit_data)0x39d2;
      local_68.multiplier_ = (float)(local_38 + dVar5);
      local_68.base_units_ = (unit_data)0x39d2;
      local_60.multiplier_ = (float)(local_38 - dVar5);
      local_60.base_units_ = (unit_data)0x39d2;
      local_30 = dVar5;
      bVar1 = units::unit::operator==(&local_58,&local_68);
      if (bVar1) {
        local_40 = local_40 + 1;
      }
      bVar1 = units::unit::operator==(&local_58,&local_60);
      if (bVar1) {
        iVar2 = iVar2 + 1;
        local_44 = iVar2;
      }
      dVar5 = local_30 + -1e-08;
    } while (2.501e-06 < dVar5);
    dVar4 = local_38 + 1e-09;
  } while (dVar4 < 1.000002);
  local_68.multiplier_ = 0.0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_58,"eqFailPos","0",&local_40,(int *)&local_68);
  if (local_58.multiplier_._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_68);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x1a6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if ((long *)CONCAT44(local_68.base_units_,local_68.multiplier_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.base_units_,local_68.multiplier_) + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  local_68.multiplier_ = 0.0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_58,"eqFailNeg","0",&local_44,(int *)&local_68);
  if (local_58.multiplier_._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_68);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x1a7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if ((long *)CONCAT44(local_68.base_units_,local_68.multiplier_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.base_units_,local_68.multiplier_) + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  return;
}

Assistant:

TEST(unitOps, inequality1)
{
    int eqFailPos = 0;
    int eqFailNeg = 0;
    double start = 1.0;
    while (start < (1.0 + 2e-6)) {
        double diff = 1e-5;
        while (diff > 2.501e-6) {
            auto u1 = unit(start, V);
            auto u2 = unit(start + diff, V);
            auto u3 = unit(start - diff, V);
            if (u1 == u2) {
                ++eqFailPos;
            }
            if (u1 == u3) {
                ++eqFailNeg;
            }
            diff -= 1e-8;
        }
        start += 1e-9;
    }
    EXPECT_EQ(eqFailPos, 0);
    EXPECT_EQ(eqFailNeg, 0);
}